

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O2

Vec_Int_t * Lpk_MergeBoundSets(Vec_Int_t *vSets0,Vec_Int_t *vSets1,int nSizeMax)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p;
  int i;
  int i_00;
  
  p = Vec_IntAlloc((int)vSets0);
  for (i = 0; i < vSets0->nSize; i = i + 1) {
    uVar1 = Vec_IntEntry(vSets0,i);
    for (i_00 = 0; i_00 < vSets1->nSize; i_00 = i_00 + 1) {
      uVar2 = Vec_IntEntry(vSets1,i_00);
      uVar2 = uVar2 | uVar1;
      if (((int)uVar2 >> 0x10 & uVar2) == 0) {
        iVar3 = Kit_WordCountOnes(uVar2 & 0xffff);
        if (iVar3 <= nSizeMax) {
          Vec_IntPush(p,uVar2);
        }
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Lpk_MergeBoundSets( Vec_Int_t * vSets0, Vec_Int_t * vSets1, int nSizeMax )
{
    Vec_Int_t * vSets;
    int Entry0, Entry1, Entry;
    int i, k;
    vSets = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vSets0, Entry0, i )
    Vec_IntForEachEntry( vSets1, Entry1, k )
    {
        Entry = Entry0 | Entry1;
        if ( (Entry & (Entry >> 16)) )
            continue;
        if ( Kit_WordCountOnes(Entry & 0xffff) <= nSizeMax )
            Vec_IntPush( vSets, Entry );
    }
    return vSets;
}